

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calc.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  _Ios_Openmode _Var2;
  exception *failure;
  ostream_iterator<float,_char,_std::char_traits<char>_> local_438;
  ostream_iterator<float,_char,_std::char_traits<char>_> *local_428;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_420;
  vector<float,_std::allocator<float>_> *local_418;
  NumberSet *numbers;
  fstream fileStream;
  undefined1 local_1f0 [8];
  CalcParser parser;
  char **argv_local;
  int argc_local;
  
  parser.variables._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  Calc::CalcParser::CalcParser((CalcParser *)local_1f0);
  if (argc < 2) {
    Calc::CalcParser::Evaluate((CalcParser *)local_1f0,(istream *)&std::cin);
  }
  else {
    pcVar1 = *(char **)(parser.variables._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
    _Var2 = std::operator|(_S_in,_S_out);
    std::fstream::fstream(&numbers,pcVar1,_Var2);
    Calc::CalcParser::Evaluate((CalcParser *)local_1f0,(istream *)&numbers);
    std::fstream::~fstream(&numbers);
  }
  local_418 = Calc::CalcParser::GetEvaluatedNumbers((CalcParser *)local_1f0);
  local_420._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(local_418);
  local_428 = (ostream_iterator<float,_char,_std::char_traits<char>_> *)
              std::vector<float,_std::allocator<float>_>::end(local_418);
  std::ostream_iterator<float,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_438,(ostream_type *)&std::cout," ");
  std::
  copy<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,std::ostream_iterator<float,char,std::char_traits<char>>>
            ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)&failure
             ,local_420,local_428);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  Calc::CalcParser::~CalcParser((CalcParser *)local_1f0);
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
    using namespace std;
    using namespace Calc;
    try {
        CalcParser parser;
        if (argc > 1) {
            fstream fileStream{argv[1]};
            parser.Evaluate(fileStream);
        } else {
            parser.Evaluate(cin);
        }
        auto const& numbers = parser.GetEvaluatedNumbers();
        copy(numbers.begin(), numbers.end(), ostream_iterator<CalcParser::Number>(cout, " "));
        cout << endl;
        return 0;
    } catch (exception const& failure) {
        cerr << failure.what() << endl;
        return 1;
    }
}